

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unparser.cc
# Opt level: O1

Status __thiscall
google::protobuf::json_internal::anon_unknown_4::
WriteRepeated<google::protobuf::json_internal::UnparseProto2Descriptor>
          (anon_unknown_4 *this,JsonWriter *writer,
          Msg<google::protobuf::json_internal::UnparseProto2Descriptor> *msg,
          Field<google::protobuf::json_internal::UnparseProto2Descriptor> field)

{
  bool bVar1;
  MessageType MVar2;
  int iVar3;
  int32_t val;
  uint32_t val_00;
  int iVar4;
  Descriptor *desc;
  anon_union_8_2_a3c22f61_for_StatusOrData<const_google::protobuf::Message_*>_3 aVar5;
  string *psVar6;
  long lVar7;
  undefined8 uVar8;
  Status *_status;
  size_t sVar9;
  char *bytes;
  float val_01;
  double dVar10;
  undefined1 auVar11 [16];
  string_view name;
  string_view sVar12;
  Metadata MVar13;
  StatusOr<long> x;
  anon_union_8_1_1246618d_for_StatusOrData<bool>_1 local_e0;
  anon_union_8_2_a3c22f61_for_StatusOrData<const_google::protobuf::Message_*>_3 local_d8;
  char *local_d0;
  uint local_ac;
  string *local_a8;
  undefined1 local_a0 [40];
  anon_union_8_2_a3c22f61_for_StatusOrData<const_google::protobuf::Message_*>_3 local_78;
  char *local_70;
  char local_68 [32];
  double local_48;
  double dStack_40;
  
  io::zc_sink_internal::ZeroCopyStreamByteSink::Append(&writer->sink_,"[",1);
  writer->indent_ = writer->indent_ + 1;
  local_a0._32_8_ = UnparseProto2Descriptor::GetSize(field,msg);
  if (local_a0._32_8_ == 0) {
    writer->indent_ = writer->indent_ + -1;
  }
  else {
    local_a8 = &writer->scratch_buf_;
    local_ac = (uint)CONCAT71((int7)((ulong)local_a8 >> 8),1);
    sVar9 = 0;
    do {
      sVar12 = Proto2Descriptor::FieldTypeName(field);
      name._M_str = sVar12._M_str;
      name._M_len = (size_t)name._M_str;
      MVar2 = ClassifyMessage((json_internal *)sVar12._M_len,name);
      iVar4 = (int)sVar9;
      if (MVar2 == kValue) {
        desc = FieldDescriptor::message_type(field);
        MVar13 = Message::GetMetadata(msg);
        local_d8.data_ = Reflection::GetRepeatedMessage(MVar13.reflection,msg,field,iVar4);
        local_e0 = (anon_union_8_1_1246618d_for_StatusOrData<bool>_1)0x1;
        *(undefined8 *)this = 1;
        bVar1 = IsEmpty<google::protobuf::json_internal::UnparseProto2Descriptor>
                          (local_d8.data_,desc);
        *(undefined8 *)this = 1;
        absl::lts_20240722::internal_statusor::StatusOrData<const_google::protobuf::Message_*>::
        ~StatusOrData((StatusOrData<const_google::protobuf::Message_*> *)&local_e0.status_);
        iVar3 = (uint)bVar1 << 2;
        if (*(long *)this != 1) {
          iVar3 = 1;
        }
        if (iVar3 != 4) {
          if (iVar3 != 0) {
            return (Status)(uintptr_t)this;
          }
          goto LAB_002d6b86;
        }
        goto LAB_002d702a;
      }
LAB_002d6b86:
      if ((local_ac & 1) == 0) {
        io::zc_sink_internal::ZeroCopyStreamByteSink::Append(&writer->sink_,",",1);
      }
      else {
        local_ac = 0;
      }
      JsonWriter::NewLine(writer);
      switch(field->type_) {
      case '\x01':
        MVar13 = Message::GetMetadata(msg);
        local_d8 = (anon_union_8_2_a3c22f61_for_StatusOrData<const_google::protobuf::Message_*>_3)
                   Reflection::GetRepeatedDouble(MVar13.reflection,msg,field,iVar4);
        local_e0 = (anon_union_8_1_1246618d_for_StatusOrData<bool>_1)0x1;
        *(undefined8 *)this = 1;
        JsonWriter::Write(writer,(double)local_d8);
        absl::lts_20240722::internal_statusor::StatusOrData<double>::~StatusOrData
                  ((StatusOrData<double> *)&local_e0.status_);
        break;
      case '\x02':
        MVar13 = Message::GetMetadata(msg);
        val_01 = Reflection::GetRepeatedFloat(MVar13.reflection,msg,field,iVar4);
        local_d8._0_4_ = val_01;
        local_e0 = (anon_union_8_1_1246618d_for_StatusOrData<bool>_1)0x1;
        *(undefined8 *)this = 1;
        JsonWriter::Write(writer,val_01);
        absl::lts_20240722::internal_statusor::StatusOrData<float>::~StatusOrData
                  ((StatusOrData<float> *)&local_e0.status_);
        break;
      case '\x03':
      case '\x10':
      case '\x12':
        MVar13 = Message::GetMetadata(msg);
        local_d8 = (anon_union_8_2_a3c22f61_for_StatusOrData<const_google::protobuf::Message_*>_3)
                   Reflection::GetRepeatedInt64(MVar13.reflection,msg,field,iVar4);
        local_e0 = (anon_union_8_1_1246618d_for_StatusOrData<bool>_1)0x1;
        *(undefined8 *)this = 1;
        if (((writer->options_).unquote_int64_if_possible == false) ||
           (bVar1 = RoundTripsThroughDouble<long>((long)local_d8), !bVar1)) {
          if (local_e0 != (anon_union_8_1_1246618d_for_StatusOrData<bool>_1)0x1) goto LAB_002d7103;
          local_78 = local_d8;
          JsonWriter::Write<long>(writer,(Quoted<long> *)&local_78);
        }
        else {
          if (local_e0 != (anon_union_8_1_1246618d_for_StatusOrData<bool>_1)0x1) {
LAB_002d7103:
            absl::lts_20240722::internal_statusor::Helper::Crash(&local_e0.status_);
            goto LAB_002d710d;
          }
          JsonWriter::Write(writer,(int64_t)local_d8);
        }
        absl::lts_20240722::internal_statusor::StatusOrData<long>::~StatusOrData
                  ((StatusOrData<long> *)&local_e0.status_);
        break;
      case '\x04':
      case '\x06':
        MVar13 = Message::GetMetadata(msg);
        aVar5 = (anon_union_8_2_a3c22f61_for_StatusOrData<const_google::protobuf::Message_*>_3)
                Reflection::GetRepeatedUInt64(MVar13.reflection,msg,field,iVar4);
        local_e0 = (anon_union_8_1_1246618d_for_StatusOrData<bool>_1)0x1;
        *(undefined8 *)this = 1;
        local_d8 = aVar5;
        if ((writer->options_).unquote_int64_if_possible == false) {
LAB_002d6e1d:
          if (local_e0 != (anon_union_8_1_1246618d_for_StatusOrData<bool>_1)0x1) {
LAB_002d710d:
            uVar8 = absl::lts_20240722::internal_statusor::Helper::Crash(&local_e0.status_);
            absl::lts_20240722::internal_statusor::StatusOrData<bool>::~StatusOrData
                      ((StatusOrData<bool> *)&local_e0.status_);
            _Unwind_Resume(uVar8);
          }
          local_78.data_ = (Message *)local_d8;
          JsonWriter::Write<unsigned_long>(writer,(Quoted<unsigned_long> *)&local_78);
        }
        else {
          auVar11._8_4_ = aVar5._4_4_;
          auVar11._0_8_ = aVar5.data_;
          auVar11._12_4_ = 0x45300000;
          dStack_40 = auVar11._8_8_ - 1.9342813113834067e+25;
          local_48 = dStack_40 + ((double)CONCAT44(0x43300000,aVar5._0_4_) - 4503599627370496.0);
          dVar10 = ldexp(1.0,0x40);
          if (aVar5.data_ !=
              (Message *)
              ((long)(local_48 - 9.223372036854776e+18) & (long)local_48 >> 0x3f | (long)local_48)
              || dVar10 <= local_48) goto LAB_002d6e1d;
          if (local_e0 != (anon_union_8_1_1246618d_for_StatusOrData<bool>_1)0x1) goto LAB_002d710d;
          JsonWriter::Write(writer,(uint64_t)local_d8);
        }
        absl::lts_20240722::internal_statusor::StatusOrData<unsigned_long>::~StatusOrData
                  ((StatusOrData<unsigned_long> *)&local_e0.status_);
        break;
      case '\x05':
      case '\x0f':
      case '\x11':
        MVar13 = Message::GetMetadata(msg);
        val = Reflection::GetRepeatedInt32(MVar13.reflection,msg,field,iVar4);
        local_d8._0_4_ = val;
        local_e0 = (anon_union_8_1_1246618d_for_StatusOrData<bool>_1)0x1;
        *(undefined8 *)this = 1;
        JsonWriter::Write(writer,val);
        goto LAB_002d6fb1;
      case '\a':
      case '\r':
        MVar13 = Message::GetMetadata(msg);
        val_00 = Reflection::GetRepeatedUInt32(MVar13.reflection,msg,field,iVar4);
        local_d8._0_4_ = val_00;
        local_e0 = (anon_union_8_1_1246618d_for_StatusOrData<bool>_1)0x1;
        *(undefined8 *)this = 1;
        JsonWriter::Write(writer,val_00);
        absl::lts_20240722::internal_statusor::StatusOrData<unsigned_int>::~StatusOrData
                  ((StatusOrData<unsigned_int> *)&local_e0.status_);
        break;
      case '\b':
        MVar13 = Message::GetMetadata(msg);
        bVar1 = Reflection::GetRepeatedBool(MVar13.reflection,msg,field,iVar4);
        local_d8._0_1_ = bVar1;
        local_e0 = (anon_union_8_1_1246618d_for_StatusOrData<bool>_1)0x1;
        *(undefined8 *)this = 1;
        bytes = "false";
        if (bVar1) {
          bytes = "true";
        }
        io::zc_sink_internal::ZeroCopyStreamByteSink::Append(&writer->sink_,bytes,(ulong)bVar1 ^ 5);
        absl::lts_20240722::internal_statusor::StatusOrData<bool>::~StatusOrData
                  ((StatusOrData<bool> *)&local_e0.status_);
        break;
      case '\t':
        MVar13 = Message::GetMetadata(msg);
        psVar6 = Reflection::GetRepeatedStringReference(MVar13.reflection,msg,field,iVar4,local_a8);
        local_d0 = (psVar6->_M_dataplus)._M_p;
        local_d8 = (anon_union_8_2_a3c22f61_for_StatusOrData<const_google::protobuf::Message_*>_3)
                   psVar6->_M_string_length;
        local_e0 = (anon_union_8_1_1246618d_for_StatusOrData<bool>_1)0x1;
        *(undefined8 *)this = 1;
        local_78 = local_d8;
        local_70 = local_d0;
        JsonWriter::Write<std::basic_string_view<char,std::char_traits<char>>>
                  (writer,(Quoted<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                          &local_78);
        goto LAB_002d700f;
      case '\n':
      case '\v':
        MVar13 = Message::GetMetadata(msg);
        aVar5.data_ = Reflection::GetRepeatedMessage(MVar13.reflection,msg,field,iVar4);
        local_e0 = (anon_union_8_1_1246618d_for_StatusOrData<bool>_1)0x1;
        *(undefined8 *)this = 1;
        local_d8.data_ = aVar5.data_;
        MVar13 = Message::GetMetadata(aVar5.data_);
        WriteMessage<google::protobuf::json_internal::UnparseProto2Descriptor>
                  (this,writer,aVar5.data_,MVar13.descriptor,false);
        absl::lts_20240722::internal_statusor::StatusOrData<const_google::protobuf::Message_*>::
        ~StatusOrData((StatusOrData<const_google::protobuf::Message_*> *)&local_e0.status_);
        goto LAB_002d7020;
      case '\f':
        MVar13 = Message::GetMetadata(msg);
        psVar6 = Reflection::GetRepeatedStringReference(MVar13.reflection,msg,field,iVar4,local_a8);
        local_d0 = (psVar6->_M_dataplus)._M_p;
        local_d8 = (anon_union_8_2_a3c22f61_for_StatusOrData<const_google::protobuf::Message_*>_3)
                   psVar6->_M_string_length;
        local_e0 = (anon_union_8_1_1246618d_for_StatusOrData<bool>_1)0x1;
        *(undefined8 *)this = 1;
        sVar12._M_str = local_d0;
        sVar12._M_len = (size_t)local_d8.data_;
        JsonWriter::WriteBase64(writer,sVar12);
LAB_002d700f:
        absl::lts_20240722::internal_statusor::
        StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>::~StatusOrData
                  ((StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                   &local_e0.status_);
        break;
      case '\x0e':
        MVar13 = Message::GetMetadata(msg);
        iVar4 = Reflection::GetRepeatedEnumValue(MVar13.reflection,msg,field,iVar4);
        local_d8._0_4_ = iVar4;
        local_e0 = (anon_union_8_1_1246618d_for_StatusOrData<bool>_1)0x1;
        *(undefined8 *)this = 1;
        WriteEnum<google::protobuf::json_internal::UnparseProto2Descriptor>
                  (writer,field,iVar4,kUnquoted);
LAB_002d6fb1:
        absl::lts_20240722::internal_statusor::StatusOrData<int>::~StatusOrData
                  ((StatusOrData<int> *)&local_e0.status_);
        break;
      default:
        local_e0 = (anon_union_8_1_1246618d_for_StatusOrData<bool>_1)0x18;
        local_d8.data_ = (Message *)0x3eb1db;
        lVar7 = absl::lts_20240722::numbers_internal::FastIntToBuffer((uint)field->type_,local_68);
        local_78.data_ = (Message *)(lVar7 - (long)local_68);
        local_70 = local_68;
        absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_a0,(AlphaNum *)&local_e0.status_);
        absl::lts_20240722::InvalidArgumentError(this,local_a0._8_8_,local_a0._0_8_);
        if ((undefined1 *)local_a0._0_8_ != local_a0 + 0x10) {
          operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
        }
        goto LAB_002d7020;
      }
      *(undefined8 *)this = 1;
LAB_002d7020:
      if (*(long *)this != 1) {
        return (Status)(uintptr_t)this;
      }
LAB_002d702a:
      sVar9 = sVar9 + 1;
    } while (local_a0._32_8_ != sVar9);
    writer->indent_ = writer->indent_ + -1;
    if ((local_ac & 1) == 0) {
      JsonWriter::NewLine(writer);
    }
  }
  io::zc_sink_internal::ZeroCopyStreamByteSink::Append(&writer->sink_,"]",1);
  *(undefined8 *)this = 1;
  return (Status)(uintptr_t)this;
}

Assistant:

absl::Status WriteRepeated(JsonWriter& writer, const Msg<Traits>& msg,
                           Field<Traits> field) {
  writer.Write("[");
  writer.Push();

  size_t count = Traits::GetSize(field, msg);
  bool first = true;
  for (size_t i = 0; i < count; ++i) {
    if (ClassifyMessage(Traits::FieldTypeName(field)) == MessageType::kValue) {
      bool empty = false;
      RETURN_IF_ERROR(Traits::WithFieldType(
          field, [&](const Desc<Traits>& desc) -> absl::Status {
            auto inner = Traits::GetMessage(field, msg, i);
            RETURN_IF_ERROR(inner.status());
            empty = IsEmpty<Traits>(**inner, desc);
            return absl::OkStatus();
          }));

      // Empty google.protobuf.Values are silently discarded.
      if (empty) {
        continue;
      }
    }
    writer.WriteComma(first);
    writer.NewLine();
    RETURN_IF_ERROR(WriteSingular<Traits>(writer, field, msg, i));
  }

  writer.Pop();
  if (!first) {
    writer.NewLine();
  }
  writer.Write("]");
  return absl::OkStatus();
}